

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::View<int,_true,_std::allocator<unsigned_long>_>::squeeze
          (View<int,_true,_std::allocator<unsigned_long>_> *this)

{
  size_t *psVar1;
  size_t *psVar2;
  size_t sVar3;
  ulong uVar4;
  runtime_error *this_00;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  
  testInvariant(this);
  if (this->data_ == (pointer)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_0022fdd3:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar9 = (this->geometry_).dimension_;
  if (sVar9 != 0) {
    sVar10 = 0;
    do {
      sVar3 = shape(this,sVar10);
      if (this->data_ == (pointer)0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
        goto LAB_0022fdd3;
      }
      sVar10 = sVar10 + 1;
      sVar9 = sVar9 - (sVar3 == 1);
      uVar4 = (this->geometry_).dimension_;
    } while (sVar10 < uVar4);
    if (sVar9 != uVar4) {
      if (sVar9 == 0) {
        marray_detail::Geometry<std::allocator<unsigned_long>_>::resize(&this->geometry_,0);
        (this->geometry_).size_ = 1;
      }
      else {
        if (uVar4 != 0) {
          psVar1 = (this->geometry_).shape_;
          psVar2 = (this->geometry_).strides_;
          uVar6 = 0;
          uVar7 = 0;
          do {
            sVar10 = psVar1[uVar7];
            if (sVar10 != 1) {
              if (uVar4 <= uVar6) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_00,"Assertion failed.");
                goto LAB_0022fdd3;
              }
              psVar1[uVar6] = sVar10;
              uVar4 = (this->geometry_).dimension_;
              if (uVar4 <= uVar7) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_00,"Assertion failed.");
                goto LAB_0022fdd3;
              }
              if (uVar4 <= uVar6) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_00,"Assertion failed.");
                goto LAB_0022fdd3;
              }
              psVar2[uVar6] = psVar2[uVar7];
              uVar6 = uVar6 + 1;
              uVar4 = (this->geometry_).dimension_;
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 < uVar4);
        }
        marray_detail::Geometry<std::allocator<unsigned_long>_>::resize(&this->geometry_,sVar9);
        sVar9 = (this->geometry_).dimension_;
        if (sVar9 == 0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Assertion failed.");
          goto LAB_0022fdd3;
        }
        psVar1 = (this->geometry_).shape_;
        psVar2 = (this->geometry_).shapeStrides_;
        if ((this->geometry_).coordinateOrder_ == FirstMajorOrder) {
          psVar2[sVar9 - 1] = 1;
          if (sVar9 != 1) {
            sVar10 = 1;
            do {
              sVar10 = sVar10 * psVar1[sVar9 - 1];
              psVar2[sVar9 - 2] = sVar10;
              sVar9 = sVar9 - 1;
            } while (sVar9 != 1);
          }
        }
        else {
          *psVar2 = 1;
          if (sVar9 != 1) {
            sVar10 = 1;
            lVar8 = 0;
            do {
              sVar10 = sVar10 * psVar1[lVar8];
              psVar2[lVar8 + 1] = sVar10;
              lVar8 = lVar8 + 1;
            } while (sVar9 - 1 != lVar8);
          }
        }
        sVar9 = (this->geometry_).dimension_;
        bVar5 = true;
        if (sVar9 != 0) {
          sVar10 = 0;
          do {
            if (psVar2[sVar10] != (this->geometry_).strides_[sVar10]) {
              bVar5 = false;
              break;
            }
            sVar10 = sVar10 + 1;
          } while (sVar9 != sVar10);
        }
        (this->geometry_).isSimple_ = bVar5;
      }
    }
  }
  testInvariant(this);
  return;
}

Assistant:

void
View<T, isConst, A>::squeeze()
{
    testInvariant();
    if(dimension() != 0) {
        std::size_t newDimension = dimension();
        for(std::size_t j=0; j<dimension(); ++j) {
            if(shape(j) == 1) {
                --newDimension;
            }
        }
        if(newDimension != dimension()) {
            if(newDimension == 0) {
                geometry_.resize(0);
                geometry_.size() = 1;
            }
            else {
                for(std::size_t j=0, k=0; j<geometry_.dimension(); ++j) {
                    if(geometry_.shape(j) != 1) {
                        geometry_.shape(k) = geometry_.shape(j);
                        geometry_.strides(k) = geometry_.strides(j);
                        ++k;
                    }
                }
                geometry_.resize(newDimension);
                marray_detail::stridesFromShape(geometry_.shapeBegin(), geometry_.shapeEnd(), 
                    geometry_.shapeStridesBegin(), geometry_.coordinateOrder());
                updateSimplicity();
            }
        }
    }
    testInvariant();
}